

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  ulong uVar1;
  char *pcVar2;
  FILE *__stream;
  bool bVar3;
  TargetType TVar4;
  reference pvVar5;
  reference dep;
  undefined8 uVar6;
  reference piVar7;
  reference __x;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  BFSEntry qe_00;
  byte local_121;
  char *local_108;
  bool uniquify;
  cmGeneratorTarget *t;
  LinkEntry *e;
  undefined1 local_98 [4];
  int i;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  __end1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  __begin1;
  vector<int,_std::allocator<int>_> local_78;
  cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> emmitted;
  BFSEntry qe;
  cmComputeLinkDepends *this_local;
  
  AddDirectLinkEntries(this);
  while (bVar3 = std::
                 queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
                 ::empty(&this->BFSQueue), ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::
             queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
             ::front(&this->BFSQueue);
    uVar1 = *(ulong *)pvVar5;
    pcVar2 = pvVar5->LibDepends;
    std::
    queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
    ::pop(&this->BFSQueue);
    qe_00._0_8_ = uVar1 & 0xffffffff;
    qe_00.LibDepends = pcVar2;
    emmitted._M_t._M_impl.super__Rb_tree_header._M_node_count = uVar1;
    FollowLinkEntry(this,qe_00);
  }
  while (bVar3 = std::
                 queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
                 ::empty(&this->SharedDepQueue), ((bVar3 ^ 0xffU) & 1) != 0) {
    dep = std::
          queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
          ::front(&this->SharedDepQueue);
    HandleSharedDependency(this,dep);
    std::
    queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
    ::pop(&this->SharedDepQueue);
  }
  InferDependencies(this);
  CleanConstraintGraph(this);
  if ((this->DebugMode & 1U) != 0) {
    fprintf(_stderr,
            "------------------------------------------------------------------------------\n");
    __stream = _stderr;
    cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    uVar6 = std::__cxx11::string::c_str();
    if ((this->HasConfig & 1U) == 0) {
      local_108 = "noconfig";
    }
    else {
      local_108 = (char *)std::__cxx11::string::c_str();
    }
    fprintf(__stream,"Link dependency analysis for target %s, config %s\n",uVar6,local_108);
    DisplayConstraintGraph(this);
  }
  OrderLinkEntires(this);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  cmReverseRange<std::vector<int,_std::allocator<int>_>_>(&local_78);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_78;
  cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::begin((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)&__end1);
  cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::end((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)local_98);
  while (bVar3 = std::operator!=(&__end1,(reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                          *)local_98), bVar3) {
    piVar7 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator*(&__end1);
    e._4_4_ = *piVar7;
    __x = std::
          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          ::operator[](&this->EntryList,(long)e._4_4_);
    bVar3 = false;
    if (__x->Target != (cmGeneratorTarget *)0x0) {
      TVar4 = cmGeneratorTarget::GetType(__x->Target);
      bVar3 = TVar4 == SHARED_LIBRARY;
    }
    local_121 = 1;
    if (bVar3) {
      pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,
                         (value_type_conflict3 *)((long)&e + 4));
      local_121 = pVar8.second;
    }
    if ((local_121 & 1) != 0) {
      std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
      ::push_back(&this->FinalLinkEntries,__x);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(&__end1);
  }
  __first = std::
            vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            ::begin(&this->FinalLinkEntries);
  __last = std::
           vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ::end(&this->FinalLinkEntries);
  std::
  reverse<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::LinkEntry*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>>
            ((__normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
              )__first._M_current,
             (__normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
              )__last._M_current);
  if ((this->DebugMode & 1U) != 0) {
    DisplayFinalEntries(this);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  return &this->FinalLinkEntries;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the final ordering.
  this->OrderLinkEntires();

  // Compute the final set of link entries.
  // Iterate in reverse order so we can keep only the last occurrence
  // of a shared library.
  std::set<int> emmitted;
  for (int i : cmReverseRange(this->FinalLinkOrder)) {
    LinkEntry const& e = this->EntryList[i];
    cmGeneratorTarget const* t = e.Target;
    // Entries that we know the linker will re-use do not need to be repeated.
    bool uniquify = t && t->GetType() == cmStateEnums::SHARED_LIBRARY;
    if (!uniquify || emmitted.insert(i).second) {
      this->FinalLinkEntries.push_back(e);
    }
  }
  // Reverse the resulting order since we iterated in reverse.
  std::reverse(this->FinalLinkEntries.begin(), this->FinalLinkEntries.end());

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}